

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_move(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint uVar1;
  TCGv_i32 val;
  TCGv_i32 pTVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  TCGv_i32 *ppTVar4;
  uint uVar5;
  
  uVar3 = CONCAT62(in_register_00000012,insn);
  uVar1 = ((uint)(uVar3 >> 0xc) & 0xfffff) - 1;
  if (2 < uVar1) {
    abort();
  }
  tcg_ctx = s->uc->tcg_ctx;
  opsize = *(int *)(&DAT_00b8b33c + (ulong)uVar1 * 4);
  val = gen_ea(env,s,(uint16_t)(uVar3 & 0xffffffff),opsize,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,
               EA_LOADS,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (val != tcg_ctx->NULL_QREG) {
    uVar1 = (uint)((uVar3 & 0xffffffff) >> 6) & 7;
    uVar5 = (uint)uVar3 >> 9 & 7;
    if (uVar1 == 1) {
      if (((uint)s->writeback_mask >> uVar5 & 1) == 0) {
        ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
      }
      else {
        ppTVar4 = s->writeback;
      }
      tcg_gen_mov_i32(tcg_ctx,ppTVar4[uVar5],val);
      return;
    }
    pTVar2 = gen_ea(env,s,(short)uVar5 + (short)uVar1 * 8,opsize,val,(TCGv_i32 *)0x0,EA_STORE,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 != tcg_ctx->NULL_QREG) {
      gen_logic_cc(s,val,opsize);
      return;
    }
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(move)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;
    int op;
    int opsize;

    switch (insn >> 12) {
    case 1: /* move.b */
        opsize = OS_BYTE;
        break;
    case 2: /* move.l */
        opsize = OS_LONG;
        break;
    case 3: /* move.w */
        opsize = OS_WORD;
        break;
    default:
        abort();
    }
    SRC_EA(env, src, opsize, 1, NULL);
    op = (insn >> 6) & 7;
    if (op == 1) {
        /* movea */
        /* The value will already have been sign extended.  */
        dest = AREG(insn, 9);
        tcg_gen_mov_i32(tcg_ctx, dest, src);
    } else {
        /* normal move */
        uint16_t dest_ea;
        dest_ea = ((insn >> 9) & 7) | (op << 3);
        DEST_EA(env, dest_ea, opsize, src, NULL);
        /* This will be correct because loads sign extend.  */
        gen_logic_cc(s, src, opsize);
    }
}